

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O0

void __thiscall
MaterialSystemTest_testStringProperty_Test::~MaterialSystemTest_testStringProperty_Test
          (MaterialSystemTest_testStringProperty_Test *this)

{
  MaterialSystemTest_testStringProperty_Test *this_local;
  
  ~MaterialSystemTest_testStringProperty_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testStringProperty) {
    aiString s;
    s.Set("Hello, this is a small test");
    this->pcMat->AddProperty(&s,"testKey6");
    s.Set("358358");
    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey6",0,0,s));
    EXPECT_STREQ("Hello, this is a small test", s.data);
}